

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureWrapTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::TextureWrapTests::init(TextureWrapTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  Context *context;
  undefined8 this_00;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  TestCaseGroup *pTVar5;
  TextureWrapCase *pTVar6;
  RenderContext *pRVar7;
  ContextInfo *pCVar8;
  char *pcVar9;
  ulong extraout_RAX;
  ulong uVar10;
  allocator<char> local_6f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  undefined1 local_618 [8];
  string name_4;
  int filter_4;
  int wrapT_4;
  int wrapS_4;
  int size_2;
  anon_struct_16_3_1dd0bf0d formatSizes [2];
  TestCaseGroup *formatGroup_1;
  string local_5b8;
  int local_594;
  string local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  undefined1 local_510 [8];
  string formatName;
  IVec3 blockSize;
  CompressedTexFormat format;
  int formatI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  undefined1 local_3f8 [8];
  string name_3;
  int filter_3;
  int wrapT_3;
  int wrapS_3;
  int size_1;
  TestCaseGroup *formatGroup;
  int formatNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  undefined1 local_2f8 [8];
  string name_2;
  int filter_2;
  int wrapT_2;
  int wrapS_2;
  undefined1 local_2a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  npotFilenames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [8];
  string name_1;
  int filter_1;
  int wrapT_1;
  int wrapS_1;
  undefined1 local_178 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  potFilenames;
  TestCaseGroup *etc1Group;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string name;
  int local_48;
  int filter;
  int wrapT;
  int wrapS;
  int size;
  TestCaseGroup *rgba8Group;
  TextureWrapTests *this_local;
  
  pTVar5 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar5,(this->super_TestCaseGroup).m_context,"rgba8","");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  for (wrapT = 0; wrapT < 2; wrapT = wrapT + 1) {
    for (filter = 0; filter < 3; filter = filter + 1) {
      for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
        for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 2;
            name.field_2._12_4_ = name.field_2._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,"",(allocator<char> *)((long)&etc1Group + 7));
          std::operator+(&local_130,&local_150,init::wrapModes[filter].name);
          std::operator+(&local_110,&local_130,"_");
          std::operator+(&local_f0,&local_110,init::wrapModes[local_48].name);
          std::operator+(&local_d0,&local_f0,"_");
          std::operator+(&local_b0,&local_d0,init::filteringModes[(int)name.field_2._12_4_].name);
          std::operator+(&local_90,&local_b0,"_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70,&local_90,init::rgba8Sizes[wrapT].name);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_150);
          std::allocator<char>::~allocator((allocator<char> *)((long)&etc1Group + 7));
          pTVar6 = (TextureWrapCase *)operator_new(0x140);
          pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
          pRVar7 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
          pCVar8 = gles3::Context::getContextInfo((this->super_TestCaseGroup).m_context);
          pcVar9 = (char *)std::__cxx11::string::c_str();
          TextureWrapCase::TextureWrapCase
                    (pTVar6,pTVar1,pRVar7,pCVar8,pcVar9,"",0x1908,0x1401,
                     init::wrapModes[filter].mode,init::wrapModes[local_48].mode,
                     init::filteringModes[(int)name.field_2._12_4_].mode,
                     init::filteringModes[(int)name.field_2._12_4_].mode,
                     init::rgba8Sizes[wrapT].width,init::rgba8Sizes[wrapT].height);
          tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar6);
          std::__cxx11::string::~string((string *)local_70);
        }
      }
    }
  }
  pTVar5 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar5,(this->super_TestCaseGroup).m_context,"etc1","");
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pTVar5;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wrapS_1,"data/etc1/photo_helsinki_mip_0.pkm",
             (allocator<char> *)((long)&wrapT_1 + 3));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_178,(value_type *)&wrapS_1);
  std::__cxx11::string::~string((string *)&wrapS_1);
  std::allocator<char>::~allocator((allocator<char> *)((long)&wrapT_1 + 3));
  for (filter_1 = 0; filter_1 < 3; filter_1 = filter_1 + 1) {
    for (name_1.field_2._12_4_ = 0; (int)name_1.field_2._12_4_ < 3;
        name_1.field_2._12_4_ = name_1.field_2._12_4_ + 1) {
      for (name_1.field_2._8_4_ = 0; (int)name_1.field_2._8_4_ < 2;
          name_1.field_2._8_4_ = name_1.field_2._8_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_288,"",
                   (allocator<char> *)
                   ((long)&npotFilenames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::operator+(&local_268,&local_288,init::wrapModes[filter_1].name);
        std::operator+(&local_248,&local_268,"_");
        std::operator+(&local_228,&local_248,init::wrapModes[(int)name_1.field_2._12_4_].name);
        std::operator+(&local_208,&local_228,"_");
        std::operator+(&local_1e8,&local_208,init::filteringModes[(int)name_1.field_2._8_4_].name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8,&local_1e8,"_pot");
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_288);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&npotFilenames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        pbVar2 = potFilenames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pTVar6 = (TextureWrapCase *)operator_new(0x140);
        pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pRVar7 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
        pCVar8 = gles3::Context::getContextInfo((this->super_TestCaseGroup).m_context);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        TextureWrapCase::TextureWrapCase
                  (pTVar6,pTVar1,pRVar7,pCVar8,pcVar9,"",init::wrapModes[filter_1].mode,
                   init::wrapModes[(int)name_1.field_2._12_4_].mode,
                   init::filteringModes[(int)name_1.field_2._8_4_].mode,
                   init::filteringModes[(int)name_1.field_2._8_4_].mode,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_178);
        tcu::TestNode::addChild((TestNode *)pbVar2,(TestNode *)pTVar6);
        std::__cxx11::string::~string((string *)local_1c8);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_2a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wrapS_2,"data/etc1/photo_helsinki_113x89.pkm",
             (allocator<char> *)((long)&wrapT_2 + 3));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2a8,(value_type *)&wrapS_2);
  std::__cxx11::string::~string((string *)&wrapS_2);
  std::allocator<char>::~allocator((allocator<char> *)((long)&wrapT_2 + 3));
  for (filter_2 = 0; filter_2 < 3; filter_2 = filter_2 + 1) {
    for (name_2.field_2._12_4_ = 0; (int)name_2.field_2._12_4_ < 3;
        name_2.field_2._12_4_ = name_2.field_2._12_4_ + 1) {
      for (name_2.field_2._8_4_ = 0; (int)name_2.field_2._8_4_ < 2;
          name_2.field_2._8_4_ = name_2.field_2._8_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&formatNdx,"",(allocator<char> *)((long)&formatGroup + 7));
        std::operator+(&local_398,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &formatNdx,init::wrapModes[filter_2].name);
        std::operator+(&local_378,&local_398,"_");
        std::operator+(&local_358,&local_378,init::wrapModes[(int)name_2.field_2._12_4_].name);
        std::operator+(&local_338,&local_358,"_");
        std::operator+(&local_318,&local_338,init::filteringModes[(int)name_2.field_2._8_4_].name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2f8,&local_318,"_npot");
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&formatNdx);
        std::allocator<char>::~allocator((allocator<char> *)((long)&formatGroup + 7));
        pbVar2 = potFilenames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pTVar6 = (TextureWrapCase *)operator_new(0x140);
        pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pRVar7 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
        pCVar8 = gles3::Context::getContextInfo((this->super_TestCaseGroup).m_context);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        TextureWrapCase::TextureWrapCase
                  (pTVar6,pTVar1,pRVar7,pCVar8,pcVar9,"",init::wrapModes[filter_2].mode,
                   init::wrapModes[(int)name_2.field_2._12_4_].mode,
                   init::filteringModes[(int)name_2.field_2._8_4_].mode,
                   init::filteringModes[(int)name_2.field_2._8_4_].mode,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2a8);
        tcu::TestNode::addChild((TestNode *)pbVar2,(TestNode *)pTVar6);
        std::__cxx11::string::~string((string *)local_2f8);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_178);
  formatGroup._0_4_ = 0;
  uVar10 = extraout_RAX;
  while ((int)(uint)formatGroup < 10) {
    pTVar5 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup
              (pTVar5,(this->super_TestCaseGroup).m_context,
               init::etc2Formats[(int)(uint)formatGroup].name,"");
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
    for (wrapT_3 = 0; wrapT_3 < 2; wrapT_3 = wrapT_3 + 1) {
      for (filter_3 = 0; filter_3 < 3; filter_3 = filter_3 + 1) {
        for (name_3.field_2._12_4_ = 0; (int)name_3.field_2._12_4_ < 3;
            name_3.field_2._12_4_ = name_3.field_2._12_4_ + 1) {
          for (name_3.field_2._8_4_ = 0; (int)name_3.field_2._8_4_ < 2;
              name_3.field_2._8_4_ = name_3.field_2._8_4_ + 1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&formatI,"",(allocator<char> *)((long)&format + 3));
            std::operator+(&local_4b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &formatI,init::wrapModes[filter_3].name);
            std::operator+(&local_498,&local_4b8,"_");
            std::operator+(&local_478,&local_498,init::wrapModes[(int)name_3.field_2._12_4_].name);
            std::operator+(&local_458,&local_478,"_");
            std::operator+(&local_438,&local_458,
                           init::filteringModes[(int)name_3.field_2._8_4_].name);
            std::operator+(&local_418,&local_438,"_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3f8,&local_418,init::etc2Sizes[wrapT_3].name);
            std::__cxx11::string::~string((string *)&local_418);
            std::__cxx11::string::~string((string *)&local_438);
            std::__cxx11::string::~string((string *)&local_458);
            std::__cxx11::string::~string((string *)&local_478);
            std::__cxx11::string::~string((string *)&local_498);
            std::__cxx11::string::~string((string *)&local_4b8);
            std::__cxx11::string::~string((string *)&formatI);
            std::allocator<char>::~allocator((allocator<char> *)((long)&format + 3));
            pTVar6 = (TextureWrapCase *)operator_new(0x140);
            pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
            pRVar7 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
            pCVar8 = gles3::Context::getContextInfo((this->super_TestCaseGroup).m_context);
            pcVar9 = (char *)std::__cxx11::string::c_str();
            TextureWrapCase::TextureWrapCase
                      (pTVar6,pTVar1,pRVar7,pCVar8,pcVar9,"",
                       init::etc2Formats[(int)(uint)formatGroup].format,
                       init::wrapModes[filter_3].mode,
                       init::wrapModes[(int)name_3.field_2._12_4_].mode,
                       init::filteringModes[(int)name_3.field_2._8_4_].mode,
                       init::filteringModes[(int)name_3.field_2._8_4_].mode,
                       init::etc2Sizes[wrapT_3].width,init::etc2Sizes[wrapT_3].height);
            tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar6);
            std::__cxx11::string::~string((string *)local_3f8);
          }
        }
      }
    }
    formatGroup._0_4_ = (uint)formatGroup + 1;
    uVar10 = (ulong)(uint)formatGroup;
  }
  blockSize.m_data[2] = 0;
  while (blockSize.m_data[2] < 0x27) {
    bVar3 = tcu::isAstcFormat(blockSize.m_data[2]);
    if (bVar3) {
      tcu::getBlockPixelSize((tcu *)(formatName.field_2._M_local_buf + 8),blockSize.m_data[2]);
      local_594 = tcu::Vector<int,_3>::x((Vector<int,_3> *)(formatName.field_2._M_local_buf + 8));
      de::toString<int>(&local_590,&local_594);
      std::operator+(&local_570,"astc_",&local_590);
      std::operator+(&local_550,&local_570,"x");
      formatGroup_1._4_4_ =
           tcu::Vector<int,_3>::y((Vector<int,_3> *)((long)&formatName.field_2 + 8));
      de::toString<int>(&local_5b8,(int *)((long)&formatGroup_1 + 4));
      std::operator+(&local_530,&local_550,&local_5b8);
      bVar3 = tcu::isAstcSRGBFormat(blockSize.m_data[2]);
      pcVar9 = "";
      if (bVar3) {
        pcVar9 = "_srgb";
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_510,
                     &local_530,pcVar9);
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_550);
      std::__cxx11::string::~string((string *)&local_570);
      std::__cxx11::string::~string((string *)&local_590);
      pTVar5 = (TestCaseGroup *)operator_new(0x78);
      context = (this->super_TestCaseGroup).m_context;
      pcVar9 = (char *)std::__cxx11::string::c_str();
      TestCaseGroup::TestCaseGroup(pTVar5,context,pcVar9,"");
      formatSizes[1]._8_8_ = pTVar5;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
      _wrapS_4 = "divisible";
      iVar4 = tcu::Vector<int,_3>::x((Vector<int,_3> *)((long)&formatName.field_2 + 8));
      formatSizes[0].name._0_4_ = iVar4 * 10;
      iVar4 = tcu::Vector<int,_3>::y((Vector<int,_3> *)((long)&formatName.field_2 + 8));
      formatSizes[0].name._4_4_ = iVar4 * 10;
      formatSizes[0]._8_8_ = anon_var_dwarf_13170d3;
      iVar4 = tcu::Vector<int,_3>::x((Vector<int,_3> *)((long)&formatName.field_2 + 8));
      formatSizes[1].name._0_4_ = iVar4 * 10 + 1;
      iVar4 = tcu::Vector<int,_3>::y((Vector<int,_3> *)((long)&formatName.field_2 + 8));
      formatSizes[1].name._4_4_ = iVar4 * 10 + 1;
      for (wrapT_4 = 0; wrapT_4 < 2; wrapT_4 = wrapT_4 + 1) {
        for (filter_4 = 0; filter_4 < 3; filter_4 = filter_4 + 1) {
          for (name_4.field_2._12_4_ = 0; (int)name_4.field_2._12_4_ < 3;
              name_4.field_2._12_4_ = name_4.field_2._12_4_ + 1) {
            for (name_4.field_2._8_4_ = 0; (int)name_4.field_2._8_4_ < 2;
                name_4.field_2._8_4_ = name_4.field_2._8_4_ + 1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"",&local_6f9)
              ;
              std::operator+(&local_6d8,&local_6f8,init::wrapModes[filter_4].name);
              std::operator+(&local_6b8,&local_6d8,"_");
              std::operator+(&local_698,&local_6b8,init::wrapModes[(int)name_4.field_2._12_4_].name)
              ;
              std::operator+(&local_678,&local_698,"_");
              std::operator+(&local_658,&local_678,
                             init::filteringModes[(int)name_4.field_2._8_4_].name);
              std::operator+(&local_638,&local_658,"_");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_618,&local_638,*(char **)(&wrapS_4 + (long)wrapT_4 * 4));
              std::__cxx11::string::~string((string *)&local_638);
              std::__cxx11::string::~string((string *)&local_658);
              std::__cxx11::string::~string((string *)&local_678);
              std::__cxx11::string::~string((string *)&local_698);
              std::__cxx11::string::~string((string *)&local_6b8);
              std::__cxx11::string::~string((string *)&local_6d8);
              std::__cxx11::string::~string((string *)&local_6f8);
              std::allocator<char>::~allocator(&local_6f9);
              this_00 = formatSizes[1]._8_8_;
              pTVar6 = (TextureWrapCase *)operator_new(0x140);
              pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
              pRVar7 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
              pCVar8 = gles3::Context::getContextInfo((this->super_TestCaseGroup).m_context);
              pcVar9 = (char *)std::__cxx11::string::c_str();
              TextureWrapCase::TextureWrapCase
                        (pTVar6,pTVar1,pRVar7,pCVar8,pcVar9,"",blockSize.m_data[2],
                         init::wrapModes[filter_4].mode,
                         init::wrapModes[(int)name_4.field_2._12_4_].mode,
                         init::filteringModes[(int)name_4.field_2._8_4_].mode,
                         init::filteringModes[(int)name_4.field_2._8_4_].mode,
                         *(int *)&formatSizes[wrapT_4].name,
                         *(int *)((long)&formatSizes[wrapT_4].name + 4));
              tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar6);
              std::__cxx11::string::~string((string *)local_618);
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)local_510);
    }
    blockSize.m_data[2] = blockSize.m_data[2] + 1;
    uVar10 = (ulong)(uint)blockSize.m_data[2];
  }
  return (int)uVar10;
}

Assistant:

void TextureWrapTests::init (void)
{
	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} filteringModes[] =
	{
		{ "nearest",	GL_NEAREST },
		{ "linear",		GL_LINEAR }
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	// RGBA8 cases.
	{
		static const struct
		{
			const char*		name;
			int				width;
			int				height;
		} rgba8Sizes[] =
		{
			{ "pot",		64, 128 },
			{ "npot",		63, 112 }
		};

		{
			TestCaseGroup* const rgba8Group = new TestCaseGroup(m_context, "rgba8", "");
			addChild(rgba8Group);

			FOR_EACH(size,		rgba8Sizes,
			FOR_EACH(wrapS,		wrapModes,
			FOR_EACH(wrapT,		wrapModes,
			FOR_EACH(filter,	filteringModes,
				{
					const string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_" + rgba8Sizes[size].name;
					rgba8Group->addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
															 GL_RGBA, GL_UNSIGNED_BYTE,
															 wrapModes[wrapS].mode,
															 wrapModes[wrapT].mode,
															 filteringModes[filter].mode, filteringModes[filter].mode,
															 rgba8Sizes[size].width, rgba8Sizes[size].height));

				}))));
		}
	}

	// ETC1 cases.
	{
		TestCaseGroup* const etc1Group = new TestCaseGroup(m_context, "etc1", "");
		addChild(etc1Group);

		// Power-of-two ETC1 texture
		std::vector<std::string> potFilenames;
		potFilenames.push_back("data/etc1/photo_helsinki_mip_0.pkm");

		FOR_EACH(wrapS,		wrapModes,
		FOR_EACH(wrapT,		wrapModes,
		FOR_EACH(filter,	filteringModes,
			{
				const string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_pot";
				etc1Group->addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
														wrapModes[wrapS].mode,
														wrapModes[wrapT].mode,
														filteringModes[filter].mode, filteringModes[filter].mode,
														potFilenames));

			})));

		std::vector<std::string> npotFilenames;
		npotFilenames.push_back("data/etc1/photo_helsinki_113x89.pkm");

		// NPOT ETC1 texture
		FOR_EACH(wrapS,		wrapModes,
		FOR_EACH(wrapT,		wrapModes,
		FOR_EACH(filter,	filteringModes,
			{
				const string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_npot";
				etc1Group->addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
														wrapModes[wrapS].mode,
														wrapModes[wrapT].mode,
														filteringModes[filter].mode, filteringModes[filter].mode,
														npotFilenames));
			})));
	}

	// ETC-2 (and EAC) cases.
	{
		static const struct
		{
			const char*			name;
			CompressedTexFormat	format;
		} etc2Formats[] =
		{
			{ "eac_r11",							tcu::COMPRESSEDTEXFORMAT_EAC_R11,							},
			{ "eac_signed_r11",						tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_R11,					},
			{ "eac_rg11",							tcu::COMPRESSEDTEXFORMAT_EAC_RG11,							},
			{ "eac_signed_rg11",					tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11,					},
			{ "etc2_rgb8",							tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8,							},
			{ "etc2_srgb8",							tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8,						},
			{ "etc2_rgb8_punchthrough_alpha1",		tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1,		},
			{ "etc2_srgb8_punchthrough_alpha1",		tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1,	},
			{ "etc2_eac_rgba8",						tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8,					},
			{ "etc2_eac_srgb8_alpha8",				tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8,				}
		};

		static const struct
		{
			const char*		name;
			int				width;
			int				height;
		} etc2Sizes[] =
		{
			{ "pot",	64,		128	},
			{ "npot",	123,	107	}
		};

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(etc2Formats); formatNdx++)
		{
			TestCaseGroup* const formatGroup = new TestCaseGroup(m_context, etc2Formats[formatNdx].name, "");
			addChild(formatGroup);

			FOR_EACH(size,		etc2Sizes,
			FOR_EACH(wrapS,		wrapModes,
			FOR_EACH(wrapT,		wrapModes,
			FOR_EACH(filter,	filteringModes,
				{
					const string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_" + etc2Sizes[size].name;
					formatGroup->addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
															  etc2Formats[formatNdx].format,
															  wrapModes[wrapS].mode,
															  wrapModes[wrapT].mode,
															  filteringModes[filter].mode, filteringModes[filter].mode,
															  etc2Sizes[size].width, etc2Sizes[size].height));
				}))));
		}
	}

	// ASTC cases.
	{
		for (int formatI = 0; formatI < tcu::COMPRESSEDTEXFORMAT_LAST; formatI++)
		{
			const CompressedTexFormat format = (CompressedTexFormat)formatI;

			if (!tcu::isAstcFormat(format))
				continue;

			{
				const tcu::IVec3		blockSize		= tcu::getBlockPixelSize(format);
				const string			formatName		= "astc_" + de::toString(blockSize.x()) + "x" + de::toString(blockSize.y()) + (tcu::isAstcSRGBFormat(format) ? "_srgb" : "");
				TestCaseGroup* const	formatGroup		= new TestCaseGroup(m_context, formatName.c_str(), "");
				addChild(formatGroup);

				DE_ASSERT(blockSize.z() == 1);

				// \note This array is NOT static.
				const struct
				{
					const char*		name;
					int				width;
					int				height;
				} formatSizes[] =
				{
					{ "divisible",		blockSize.x()*10,		blockSize.y()*10	},
					{ "not_divisible",	blockSize.x()*10+1,		blockSize.y()*10+1	},
				};

				FOR_EACH(size,		formatSizes,
				FOR_EACH(wrapS,		wrapModes,
				FOR_EACH(wrapT,		wrapModes,
				FOR_EACH(filter,	filteringModes,
					{
						string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_" + formatSizes[size].name;
						formatGroup->addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
																  format,
																  wrapModes[wrapS].mode,
																  wrapModes[wrapT].mode,
																  filteringModes[filter].mode, filteringModes[filter].mode,
																  formatSizes[size].width, formatSizes[size].height));
					}))));
			}
		}
	}
}